

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

_Bool ggml_gallocr_reserve_n
                (ggml_gallocr_t galloc,ggml_cgraph *graph,int *node_buffer_ids,int *leaf_buffer_ids)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  _func_size_t_ggml_backend_buffer_type_t_ggml_tensor_ptr *size;
  void *pvVar4;
  _func_char_ptr_ggml_backend_buffer_type_t *p_Var5;
  hash_node *phVar6;
  size_t sVar7;
  _func_size_t_ggml_backend_buffer_type_t *p_Var8;
  ggml_backend_buffer_t pgVar9;
  ggml_backend_buffer_t pgVar10;
  char *pcVar11;
  ggml_backend_buffer_type_t in_RCX;
  long in_RSI;
  ggml_backend_buffer_type_t in_RDI;
  undefined4 unaff_retaddr;
  undefined4 unaff_retaddr_00;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  ggml_gallocr_t in_stack_00000010;
  size_t new_size;
  size_t cur_size;
  int j_1;
  int i_3;
  hash_node *hn_2;
  ggml_tensor *leaf;
  int i_2;
  hash_node *hn_1;
  ggml_tensor *src;
  int j;
  hash_node *hn;
  node_alloc *node_alloc;
  ggml_tensor *node;
  int i_1;
  int i;
  size_t min_hash_size;
  undefined4 in_stack_ffffffffffffff38;
  ggml_backend_buffer_usage in_stack_ffffffffffffff3c;
  ggml_tensor *in_stack_ffffffffffffff40;
  ggml_backend_buffer_t buffer;
  ggml_backend_buffer_type_t in_stack_ffffffffffffff48;
  int local_a0;
  int local_9c;
  int local_84;
  int local_6c;
  int local_50;
  int local_4c;
  _func_size_t_ggml_backend_buffer_type_t_ggml_tensor_ptr *local_48;
  _func__Bool_ggml_backend_buffer_type_t *local_40;
  ggml_backend_dev_t local_38;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar3 = (ulong)(*(int *)(in_RSI + 4) + *(int *)(in_RSI + 8));
  size = (_func_size_t_ggml_backend_buffer_type_t_ggml_tensor_ptr *)((uVar3 >> 2) + uVar3);
  if ((in_RDI->iface).get_alloc_size < size) {
    ggml_hash_set_free((ggml_hash_set *)0x15b32e);
    in_stack_ffffffffffffff48 = in_RDI;
    ggml_hash_set_new((size_t)in_stack_ffffffffffffff40);
    (in_stack_ffffffffffffff48->iface).get_alloc_size = local_48;
    (in_stack_ffffffffffffff48->iface).is_host = local_40;
    in_stack_ffffffffffffff48->device = local_38;
    if (in_RDI->device == (ggml_backend_dev_t)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
                 ,0x2aa,"GGML_ASSERT(%s) failed","galloc->hash_set.keys != NULL");
    }
    free(in_RDI->context);
    pvVar4 = malloc((long)(in_RDI->iface).get_alloc_size << 5);
    in_RDI->context = pvVar4;
    if (in_RDI->context == (void *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
                 ,0x2ae,"GGML_ASSERT(%s) failed","galloc->hash_values != NULL");
    }
  }
  for (local_4c = 0; local_4c < *(int *)&(in_RDI->iface).get_max_size; local_4c = local_4c + 1) {
    ggml_dyn_tallocr_reset
              (*(ggml_dyn_tallocr **)((in_RDI->iface).get_alignment + (long)local_4c * 8));
  }
  ggml_gallocr_alloc_graph_impl
            (in_stack_00000010,(ggml_cgraph *)CONCAT44(in_stack_0000000c,in_stack_00000008),
             (int *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (int *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  if (*(int *)&in_RDI[1].iface.alloc_buffer < *(int *)(in_RSI + 4)) {
    free(in_RDI[1].iface.get_name);
    p_Var5 = (_func_char_ptr_ggml_backend_buffer_type_t *)calloc((long)*(int *)(in_RSI + 4),0x108);
    in_RDI[1].iface.get_name = p_Var5;
    if (in_RDI[1].iface.get_name == (_func_char_ptr_ggml_backend_buffer_type_t *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
                 ,0x2bd,"GGML_ASSERT(%s) failed","galloc->node_allocs != NULL");
    }
  }
  *(undefined4 *)&in_RDI[1].iface.alloc_buffer = *(undefined4 *)(in_RSI + 4);
  for (local_50 = 0; local_50 < *(int *)(in_RSI + 4); local_50 = local_50 + 1) {
    lVar1 = *(long *)(*(long *)(in_RSI + 0x10) + (long)local_50 * 8);
    p_Var5 = in_RDI[1].iface.get_name + (long)local_50 * 0x108;
    if ((*(long *)(lVar1 + 0xe8) == 0) && (*(long *)(lVar1 + 0xf8) == 0)) {
      phVar6 = ggml_gallocr_hash_get
                         ((ggml_gallocr_t)in_stack_ffffffffffffff40,
                          (ggml_tensor *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      *(int *)p_Var5 = phVar6->buffer_id;
      *(size_t *)(p_Var5 + 8) = phVar6->offset;
      sVar7 = ggml_backend_buft_get_alloc_size(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      *(size_t *)(p_Var5 + 0x10) = sVar7;
    }
    else {
      *(int *)p_Var5 = -1;
      *(undefined8 *)(p_Var5 + 8) = 0xffffffffffffffff;
      *(undefined8 *)(p_Var5 + 0x10) = 0;
    }
    for (local_6c = 0; local_6c < 10; local_6c = local_6c + 1) {
      lVar2 = *(long *)(lVar1 + 0x98 + (long)local_6c * 8);
      if (((lVar2 == 0) || (*(long *)(lVar2 + 0xe8) != 0)) || (*(long *)(lVar2 + 0xf8) != 0)) {
        *(undefined4 *)(p_Var5 + ((long)local_6c * 6 + 6) * 4) = 0xffffffff;
        *(undefined8 *)(p_Var5 + ((long)local_6c * 6 + 8) * 4) = 0xffffffffffffffff;
        *(undefined8 *)(p_Var5 + ((long)local_6c * 6 + 10) * 4) = 0;
      }
      else {
        phVar6 = ggml_gallocr_hash_get
                           ((ggml_gallocr_t)in_stack_ffffffffffffff40,
                            (ggml_tensor *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        *(int *)(p_Var5 + ((long)local_6c * 6 + 6) * 4) = phVar6->buffer_id;
        *(size_t *)(p_Var5 + ((long)local_6c * 6 + 8) * 4) = phVar6->offset;
        sVar7 = ggml_backend_buft_get_alloc_size
                          (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        *(size_t *)(p_Var5 + ((long)local_6c * 6 + 10) * 4) = sVar7;
      }
    }
  }
  if (*(int *)&in_RDI[1].iface.get_max_size < *(int *)(in_RSI + 8)) {
    free(in_RDI[1].iface.get_alignment);
    p_Var8 = (_func_size_t_ggml_backend_buffer_type_t *)calloc((long)*(int *)(in_RSI + 8),0x18);
    in_RDI[1].iface.get_alignment = p_Var8;
    if (in_RDI[1].iface.get_alignment == (_func_size_t_ggml_backend_buffer_type_t *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
                 ,0x2de,"GGML_ASSERT(%s) failed","galloc->leaf_allocs != NULL");
    }
  }
  *(undefined4 *)&in_RDI[1].iface.get_max_size = *(undefined4 *)(in_RSI + 8);
  for (local_84 = 0; local_84 < *(int *)(in_RSI + 8); local_84 = local_84 + 1) {
    lVar1 = *(long *)(*(long *)(in_RSI + 0x28) + (long)local_84 * 8);
    phVar6 = ggml_gallocr_hash_get
                       ((ggml_gallocr_t)in_stack_ffffffffffffff40,
                        (ggml_tensor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                       );
    if ((*(long *)(lVar1 + 0xe8) == 0) && (*(long *)(lVar1 + 0xf8) == 0)) {
      *(int *)(in_RDI[1].iface.get_alignment + (long)local_84 * 0x18) = phVar6->buffer_id;
      *(size_t *)(in_RDI[1].iface.get_alignment + (long)local_84 * 0x18 + 8) = phVar6->offset;
      sVar7 = ggml_backend_buft_get_alloc_size(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      *(size_t *)(in_RDI[1].iface.get_alignment + (long)local_84 * 0x18 + 0x10) = sVar7;
    }
    else {
      *(undefined4 *)(in_RDI[1].iface.get_alignment + (long)local_84 * 0x18) = 0xffffffff;
      *(undefined8 *)(in_RDI[1].iface.get_alignment + (long)local_84 * 0x18 + 8) =
           0xffffffffffffffff;
      *(undefined8 *)(in_RDI[1].iface.get_alignment + (long)local_84 * 0x18 + 0x10) = 0;
    }
  }
  local_9c = 0;
  do {
    if (*(int *)&(in_RDI->iface).get_max_size <= local_9c) {
      return true;
    }
    for (local_a0 = 0; local_a0 < local_9c; local_a0 = local_a0 + 1) {
      if (*(long *)((in_RDI->iface).get_alignment + (long)local_a0 * 8) ==
          *(long *)((in_RDI->iface).get_alignment + (long)local_9c * 8)) {
        *(undefined8 *)((in_RDI->iface).alloc_buffer + (long)local_9c * 8) =
             *(undefined8 *)((in_RDI->iface).alloc_buffer + (long)local_a0 * 8);
        break;
      }
    }
    if (*(long *)((in_RDI->iface).alloc_buffer + (long)local_9c * 8) == 0) {
      pgVar9 = (ggml_backend_buffer_t)0x0;
    }
    else {
      pgVar9 = (ggml_backend_buffer_t)
               ggml_backend_buffer_get_size
                         (*(ggml_backend_buffer_t *)
                           ((in_RDI->iface).alloc_buffer + (long)local_9c * 8));
    }
    buffer = pgVar9;
    pgVar10 = (ggml_backend_buffer_t)
              ggml_dyn_tallocr_max_size
                        (*(ggml_dyn_tallocr **)((in_RDI->iface).get_alignment + (long)local_9c * 8))
    ;
    if ((pgVar9 < pgVar10) || (*(long *)((in_RDI->iface).alloc_buffer + (long)local_9c * 8) == 0)) {
      ggml_backend_buffer_free(buffer);
      pgVar9 = ggml_backend_buft_alloc_buffer(in_RCX,(size_t)size);
      *(ggml_backend_buffer_t *)((in_RDI->iface).alloc_buffer + (long)local_9c * 8) = pgVar9;
      if (*(long *)((in_RDI->iface).alloc_buffer + (long)local_9c * 8) == 0) {
        pcVar11 = ggml_backend_buft_name((ggml_backend_buffer_type_t)0x15bb1a);
        ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %s buffer of size %zu\n",
                          "ggml_gallocr_reserve_n",pcVar11,pgVar10);
        return false;
      }
      ggml_backend_buffer_set_usage(buffer,in_stack_ffffffffffffff3c);
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool ggml_gallocr_reserve_n(ggml_gallocr_t galloc, struct ggml_cgraph * graph, const int * node_buffer_ids, const int * leaf_buffer_ids) {
    size_t min_hash_size = graph->n_nodes + graph->n_leafs;
    // add 25% margin to avoid hash collisions
    min_hash_size += min_hash_size / 4;

    // initialize hash table
    if (galloc->hash_set.size < min_hash_size) {
        ggml_hash_set_free(&galloc->hash_set);
        galloc->hash_set = ggml_hash_set_new(min_hash_size);
        GGML_ASSERT(galloc->hash_set.keys != NULL);

        free(galloc->hash_values);
        galloc->hash_values = malloc(sizeof(struct hash_node) * galloc->hash_set.size);
        GGML_ASSERT(galloc->hash_values != NULL);
    }

    // reset allocators
    for (int i = 0; i < galloc->n_buffers; i++) {
        ggml_dyn_tallocr_reset(galloc->buf_tallocs[i]);
    }

    // allocate in hash table
    ggml_gallocr_alloc_graph_impl(galloc, graph, node_buffer_ids, leaf_buffer_ids);

    // set the node_allocs from the hash table
    if (galloc->n_nodes < graph->n_nodes) {
        free(galloc->node_allocs);
        galloc->node_allocs = calloc(graph->n_nodes, sizeof(struct node_alloc));
        GGML_ASSERT(galloc->node_allocs != NULL);
    }
    galloc->n_nodes = graph->n_nodes;
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        struct node_alloc * node_alloc = &galloc->node_allocs[i];
        if (node->view_src || node->data) {
            node_alloc->dst.buffer_id = -1;
            node_alloc->dst.offset = SIZE_MAX;
            node_alloc->dst.size_max = 0;
        } else {
            struct hash_node * hn = ggml_gallocr_hash_get(galloc, node);
            node_alloc->dst.buffer_id = hn->buffer_id;
            node_alloc->dst.offset    = hn->offset;
            node_alloc->dst.size_max  = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], node);
        }
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (!src || src->view_src || src->data) {
                node_alloc->src[j].buffer_id = -1;
                node_alloc->src[j].offset = SIZE_MAX;
                node_alloc->src[j].size_max = 0;
            } else {
                struct hash_node * hn = ggml_gallocr_hash_get(galloc, src);
                node_alloc->src[j].buffer_id = hn->buffer_id;
                node_alloc->src[j].offset   = hn->offset;
                node_alloc->src[j].size_max = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], src);
            }
        }
    }
    if (galloc->n_leafs < graph->n_leafs) {
        free(galloc->leaf_allocs);
        galloc->leaf_allocs = calloc(graph->n_leafs, sizeof(galloc->leaf_allocs[0]));
        GGML_ASSERT(galloc->leaf_allocs != NULL);
    }
    galloc->n_leafs = graph->n_leafs;
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        struct hash_node * hn = ggml_gallocr_hash_get(galloc, leaf);
        if (leaf->view_src || leaf->data) {
            galloc->leaf_allocs[i].leaf.buffer_id = -1;
            galloc->leaf_allocs[i].leaf.offset = SIZE_MAX;
            galloc->leaf_allocs[i].leaf.size_max = 0;
        } else {
            galloc->leaf_allocs[i].leaf.buffer_id = hn->buffer_id;
            galloc->leaf_allocs[i].leaf.offset = hn->offset;
            galloc->leaf_allocs[i].leaf.size_max = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], leaf);
        }
    }

    // reallocate buffers if needed
    for (int i = 0; i < galloc->n_buffers; i++) {
        // if the buffer type is used multiple times, we reuse the same buffer
        for (int j = 0; j < i; j++) {
            if (galloc->buf_tallocs[j] == galloc->buf_tallocs[i]) {
                galloc->buffers[i] = galloc->buffers[j];
                break;
            }
        }

        size_t cur_size = galloc->buffers[i] ? ggml_backend_buffer_get_size(galloc->buffers[i]) : 0;
        size_t new_size = ggml_dyn_tallocr_max_size(galloc->buf_tallocs[i]);

        // even if there are no tensors allocated in this buffer, we still need to allocate it to initialize views
        if (new_size > cur_size || galloc->buffers[i] == NULL) {
#ifndef NDEBUG
            GGML_LOG_DEBUG("%s: reallocating %s buffer from size %.02f MiB to %.02f MiB\n", __func__, ggml_backend_buft_name(galloc->bufts[i]), cur_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
#endif

            ggml_backend_buffer_free(galloc->buffers[i]);
            galloc->buffers[i] = ggml_backend_buft_alloc_buffer(galloc->bufts[i], new_size);
            if (galloc->buffers[i] == NULL) {
                GGML_LOG_ERROR("%s: failed to allocate %s buffer of size %zu\n", __func__, ggml_backend_buft_name(galloc->bufts[i]), new_size);
                return false;
            }
            ggml_backend_buffer_set_usage(galloc->buffers[i], GGML_BACKEND_BUFFER_USAGE_COMPUTE);
        }
    }

    return true;
}